

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

uint16_t * __thiscall
icu_63::Normalizer2Impl::getCompositionsListForDecompYes(Normalizer2Impl *this,uint16_t norm16)

{
  uint16_t norm16_local;
  Normalizer2Impl *this_local;
  
  if ((norm16 < 2) || (0xfbff < norm16)) {
    this_local = (Normalizer2Impl *)0x0;
  }
  else if (norm16 < this->minMaybeYes) {
    this_local = (Normalizer2Impl *)getMapping(this,norm16);
  }
  else {
    this_local = (Normalizer2Impl *)
                 (this->maybeYesCompositions +
                 ((long)(int)(uint)norm16 - (long)(int)(uint)this->minMaybeYes));
  }
  return (uint16_t *)this_local;
}

Assistant:

const uint16_t *getCompositionsListForDecompYes(uint16_t norm16) const {
        if(norm16<JAMO_L || MIN_NORMAL_MAYBE_YES<=norm16) {
            return NULL;
        } else if(norm16<minMaybeYes) {
            return getMapping(norm16);  // for yesYes; if Jamo L: harmless empty list
        } else {
            return maybeYesCompositions+norm16-minMaybeYes;
        }
    }